

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall cxxopts::values::abstract_value<bool>::~abstract_value(abstract_value<bool> *this)

{
  _Atomic_word *p_Var1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_001e28b0;
  pcVar2 = (this->m_implicit_value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_implicit_value).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->m_default_value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_default_value).field_2) {
    operator_delete(pcVar2);
  }
  p_Var3 = (this->m_result).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
           super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

~abstract_value() override = default;